

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
yy::mylanguage_parser::yypush_(mylanguage_parser *this,char *m,state_type s,symbol_type *sym)

{
  basic_symbol<yy::mylanguage_parser::by_state> local_88;
  
  stack_symbol_type::stack_symbol_type((stack_symbol_type *)&local_88,s,sym);
  yypush_(this,m,(stack_symbol_type *)&local_88);
  basic_symbol<yy::mylanguage_parser::by_state>::~basic_symbol(&local_88);
  return;
}

Assistant:

void
  mylanguage_parser::yypush_ (const char* m, state_type s, YY_MOVE_REF (symbol_type) sym)
  {
#if 201103L <= YY_CPLUSPLUS
    yypush_ (m, stack_symbol_type (s, std::move (sym)));
#else
    stack_symbol_type ss (s, sym);
    yypush_ (m, ss);
#endif
  }